

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O3

uint8_t * lre_compile(int *plen,char *error_msg,int error_msg_size,char *buf,size_t buf_len,
                     int re_flags,void *opaque)

{
  DynBuf *s;
  int iVar1;
  int iVar2;
  char *fmt;
  int iVar3;
  uint uVar4;
  int iVar5;
  REParseState s_s;
  uint8_t local_164 [4];
  char *local_160;
  int *local_158;
  REParseState local_150;
  
  local_160 = error_msg;
  local_158 = plen;
  memset(&local_150,0,0x120);
  local_150.opaque = opaque;
  local_150.buf_end = (uint8_t *)(buf + buf_len);
  local_150.is_utf16 = (uint)re_flags >> 4 & 1;
  local_150.ignore_case = (uint)re_flags >> 1 & 1;
  local_150.dotall = (uint)re_flags >> 3 & 1;
  local_150.capture_count = 1;
  local_150.total_capture_count = -1;
  local_150.has_named_captures = -1;
  local_150.buf_ptr = (uint8_t *)buf;
  local_150.buf_start = (uint8_t *)buf;
  local_150.re_flags = re_flags;
  dbuf_init2(&local_150.byte_code,opaque,lre_realloc);
  s = &local_150.group_names;
  dbuf_init2(s,opaque,lre_realloc);
  dbuf_putc(&local_150.byte_code,(uint8_t)re_flags);
  dbuf_putc(&local_150.byte_code,'\0');
  dbuf_putc(&local_150.byte_code,'\0');
  local_164[0] = '\0';
  local_164[1] = '\0';
  local_164[2] = '\0';
  local_164[3] = '\0';
  dbuf_put(&local_150.byte_code,local_164,4);
  if ((re_flags & 0x20U) == 0) {
    dbuf_putc(&local_150.byte_code,'\b');
    local_164[0] = '\x06';
    local_164[1] = '\0';
    local_164[2] = '\0';
    local_164[3] = '\0';
    dbuf_put(&local_150.byte_code,local_164,4);
    dbuf_putc(&local_150.byte_code,'\x04');
    dbuf_putc(&local_150.byte_code,'\a');
    local_164[0] = 0xf5;
    local_164[1] = 0xff;
    local_164[2] = 0xff;
    local_164[3] = 0xff;
    dbuf_put(&local_150.byte_code,local_164,4);
  }
  dbuf_putc(&local_150.byte_code,'\v');
  dbuf_putc(&local_150.byte_code,'\0');
  iVar1 = re_parse_disjunction(&local_150,0);
  if (iVar1 == 0) {
    dbuf_putc(&local_150.byte_code,'\f');
    dbuf_putc(&local_150.byte_code,'\0');
    dbuf_putc(&local_150.byte_code,'\n');
    if (*local_150.buf_ptr == '\0') {
      if (local_150.byte_code.error == 0) {
        iVar1 = 0;
        if ((int)local_150.byte_code.size < 8) {
LAB_0016dbeb:
          local_150.byte_code.buf[1] = (byte)local_150.capture_count;
          local_150.byte_code.buf[2] = (byte)iVar1;
          *(int *)(local_150.byte_code.buf + 3) = (int)local_150.byte_code.size + -7;
          if ((long)local_150.capture_count - 1U < local_150.group_names.size) {
            dbuf_put(&local_150.byte_code,local_150.group_names.buf,local_150.group_names.size);
            *local_150.byte_code.buf = *local_150.byte_code.buf | 0x80;
          }
          dbuf_free(s);
          *local_160 = '\0';
          *local_158 = (int)local_150.byte_code.size;
          return local_150.byte_code.buf;
        }
        iVar3 = 0;
        fmt = "too many imbricated quantifiers";
        iVar1 = 0;
        iVar5 = 0;
        do {
          uVar4 = (uint)reopcode_info[local_150.byte_code.buf[(long)iVar3 + 7]].size;
          iVar2 = iVar5;
          switch(local_150.byte_code.buf[(long)iVar3 + 7]) {
          case '\x0f':
          case '\x19':
            iVar2 = iVar5 + 1;
            if ((iVar5 < iVar1) || (iVar1 = iVar2, iVar5 < 0xff)) goto LAB_0016dbd9;
            goto LAB_0016daf5;
          case '\x10':
          case '\x1a':
            iVar2 = iVar5 + -1;
            break;
          case '\x15':
            uVar4 = uVar4 + (uint)*(ushort *)(local_150.byte_code.buf + (long)iVar3 + 8) * 4;
            break;
          case '\x16':
            uVar4 = uVar4 + (uint)*(ushort *)(local_150.byte_code.buf + (long)iVar3 + 8) * 8;
          }
LAB_0016dbd9:
          iVar3 = iVar3 + uVar4;
          iVar5 = iVar2;
        } while (iVar3 < (int)local_150.byte_code.size + -7);
        if (-1 < iVar1) goto LAB_0016dbeb;
      }
      else {
        fmt = "out of memory";
      }
    }
    else {
      fmt = "extraneous characters at the end";
    }
LAB_0016daf5:
    re_parse_error(&local_150,fmt);
  }
  dbuf_free(&local_150.byte_code);
  dbuf_free(s);
  pstrcpy(local_160,error_msg_size,local_150.u.error_msg);
  *local_158 = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *lre_compile(int *plen, char *error_msg, int error_msg_size,
                     const char *buf, size_t buf_len, int re_flags,
                     void *opaque)
{
    REParseState s_s, *s = &s_s;
    int stack_size;
    BOOL is_sticky;
    
    memset(s, 0, sizeof(*s));
    s->opaque = opaque;
    s->buf_ptr = (const uint8_t *)buf;
    s->buf_end = s->buf_ptr + buf_len;
    s->buf_start = s->buf_ptr;
    s->re_flags = re_flags;
    s->is_utf16 = ((re_flags & LRE_FLAG_UTF16) != 0);
    is_sticky = ((re_flags & LRE_FLAG_STICKY) != 0);
    s->ignore_case = ((re_flags & LRE_FLAG_IGNORECASE) != 0);
    s->dotall = ((re_flags & LRE_FLAG_DOTALL) != 0);
    s->capture_count = 1;
    s->total_capture_count = -1;
    s->has_named_captures = -1;
    
    dbuf_init2(&s->byte_code, opaque, lre_realloc);
    dbuf_init2(&s->group_names, opaque, lre_realloc);

    dbuf_putc(&s->byte_code, re_flags); /* first element is the flags */
    dbuf_putc(&s->byte_code, 0); /* second element is the number of captures */
    dbuf_putc(&s->byte_code, 0); /* stack size */
    dbuf_put_u32(&s->byte_code, 0); /* bytecode length */
    
    if (!is_sticky) {
        /* iterate thru all positions (about the same as .*?( ... ) )
           .  We do it without an explicit loop so that lock step
           thread execution will be possible in an optimized
           implementation */
        re_emit_op_u32(s, REOP_split_goto_first, 1 + 5);
        re_emit_op(s, REOP_any);
        re_emit_op_u32(s, REOP_goto, -(5 + 1 + 5));
    }
    re_emit_op_u8(s, REOP_save_start, 0);

    if (re_parse_disjunction(s, FALSE)) {
    error:
        dbuf_free(&s->byte_code);
        dbuf_free(&s->group_names);
        pstrcpy(error_msg, error_msg_size, s->u.error_msg);
        *plen = 0;
        return NULL;
    }

    re_emit_op_u8(s, REOP_save_end, 0);
    
    re_emit_op(s, REOP_match);

    if (*s->buf_ptr != '\0') {
        re_parse_error(s, "extraneous characters at the end");
        goto error;
    }

    if (dbuf_error(&s->byte_code)) {
        re_parse_out_of_memory(s);
        goto error;
    }
    
    stack_size = compute_stack_size(s->byte_code.buf, s->byte_code.size);
    if (stack_size < 0) {
        re_parse_error(s, "too many imbricated quantifiers");
        goto error;
    }
    
    s->byte_code.buf[RE_HEADER_CAPTURE_COUNT] = s->capture_count;
    s->byte_code.buf[RE_HEADER_STACK_SIZE] = stack_size;
    put_u32(s->byte_code.buf + 3, s->byte_code.size - RE_HEADER_LEN);

    /* add the named groups if needed */
    if (s->group_names.size > (s->capture_count - 1)) {
        dbuf_put(&s->byte_code, s->group_names.buf, s->group_names.size);
        s->byte_code.buf[RE_HEADER_FLAGS] |= LRE_FLAG_NAMED_GROUPS;
    }
    dbuf_free(&s->group_names);
    
#ifdef DUMP_REOP
    lre_dump_bytecode(s->byte_code.buf, s->byte_code.size);
#endif
    
    error_msg[0] = '\0';
    *plen = s->byte_code.size;
    return s->byte_code.buf;
}